

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O0

void __thiscall cs::statement_foreach::dump(statement_foreach *this,ostream *o)

{
  bool bVar1;
  ostream *poVar2;
  reference ppsVar3;
  ostream *in_RSI;
  _Self *in_RDI;
  statement_base **ptr;
  const_iterator __end1;
  const_iterator __begin1;
  deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *__range1;
  _Self *in_stack_ffffffffffffff88;
  ostream *in_stack_ffffffffffffffa8;
  iterator in_stack_ffffffffffffffb0;
  _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
  local_40;
  _Elt_pointer *local_20;
  tree_node *local_18;
  ostream *local_10;
  
  local_10 = in_RSI;
  std::operator<<(in_RSI,"< BeginForEach >\n");
  poVar2 = std::operator<<(local_10,"< IteratorID = \"");
  poVar2 = std::operator<<(poVar2,(string *)(in_RDI + 1));
  std::operator<<(poVar2,"\", TargetValue = ");
  local_18 = (tree_node *)
             tree_type<cs::token_base_*>::root
                       ((tree_type<cs::token_base_*> *)in_stack_ffffffffffffff88);
  compiler_type::dump_expr(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::operator<<(local_10," >\n< Body >\n");
  local_20 = &in_RDI[2]._M_first;
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::begin
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff88);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::end
            ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
             in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffff88);
    if (!bVar1) break;
    ppsVar3 = std::
              _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
              ::operator*(&local_40);
    (*(*ppsVar3)->_vptr_statement_base[5])(*ppsVar3,local_10);
    std::
    _Deque_iterator<cs::statement_base_*,_cs::statement_base_*const_&,_cs::statement_base_*const_*>
    ::operator++(in_RDI);
  }
  std::operator<<(local_10,"< EndForEach >\n");
  return;
}

Assistant:

void statement_foreach::dump(std::ostream &o) const
	{
		o << "< BeginForEach >\n";
		o << "< IteratorID = \"" << mIt << "\", TargetValue = ";
		compiler_type::dump_expr(mObj.root(), o);
		o << " >\n< Body >\n";
		for (auto &ptr: mBlock)
			ptr->dump(o);
		o << "< EndForEach >\n";
	}